

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O0

void ZopfliBlockSplit(ZopfliOptions *options,uchar *in,size_t instart,size_t inend,size_t maxblocks,
                     size_t **splitpoints,size_t *npoints)

{
  uchar *in_RSI;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  size_t length;
  ZopfliHash *h;
  ZopfliHash hash;
  ZopfliLZ77Store store;
  size_t nlz77points;
  size_t *lz77splitpoints;
  ZopfliBlockState s;
  size_t i;
  size_t pos;
  ZopfliHash *in_stack_00000128;
  size_t in_stack_00000138;
  size_t in_stack_00000140;
  uchar *in_stack_00000148;
  ZopfliBlockState *in_stack_00000150;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  size_t in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  ZopfliOptions *in_stack_fffffffffffffef0;
  size_t *in_stack_ffffffffffffff30;
  size_t **in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  ZopfliLZ77Store *in_stack_ffffffffffffff48;
  ZopfliOptions *in_stack_ffffffffffffff50;
  
  ZopfliInitLZ77Store(in_RSI,(ZopfliLZ77Store *)&stack0xffffffffffffff48);
  ZopfliInitBlockState
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(ZopfliBlockState *)0x10ce96);
  ZopfliAllocHash(in_stack_fffffffffffffee0,
                  (ZopfliHash *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  *in_stack_00000008 = 0;
  *in_R9 = 0;
  ZopfliLZ77Greedy(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                   (ZopfliLZ77Store *)npoints,in_stack_00000128);
  ZopfliBlockSplitLZ77
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  free((void *)0x0);
  ZopfliCleanBlockState((ZopfliBlockState *)0x10d0d3);
  ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x10d0dd);
  ZopfliCleanHash((ZopfliHash *)0x10d0e7);
  return;
}

Assistant:

void ZopfliBlockSplit(const ZopfliOptions* options,
                      const unsigned char* in, size_t instart, size_t inend,
                      size_t maxblocks, size_t** splitpoints, size_t* npoints) {
  size_t pos = 0;
  size_t i;
  ZopfliBlockState s;
  size_t* lz77splitpoints = 0;
  size_t nlz77points = 0;
  ZopfliLZ77Store store;
  ZopfliHash hash;
  ZopfliHash* h = &hash;

  ZopfliInitLZ77Store(in, &store);
  ZopfliInitBlockState(options, instart, inend, 0, &s);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  *npoints = 0;
  *splitpoints = 0;

  /* Unintuitively, Using a simple LZ77 method here instead of ZopfliLZ77Optimal
  results in better blocks. */
  ZopfliLZ77Greedy(&s, in, instart, inend, &store, h);

  ZopfliBlockSplitLZ77(options,
                       &store, maxblocks,
                       &lz77splitpoints, &nlz77points);

  /* Convert LZ77 positions to positions in the uncompressed input. */
  pos = instart;
  if (nlz77points > 0) {
    for (i = 0; i < store.size; i++) {
      size_t length = store.dists[i] == 0 ? 1 : store.litlens[i];
      if (lz77splitpoints[*npoints] == i) {
        ZOPFLI_APPEND_DATA(pos, splitpoints, npoints);
        if (*npoints == nlz77points) break;
      }
      pos += length;
    }
  }
  assert(*npoints == nlz77points);

  free(lz77splitpoints);
  ZopfliCleanBlockState(&s);
  ZopfliCleanLZ77Store(&store);
  ZopfliCleanHash(h);
}